

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void pstd::swap<pbrt::Image>(Image *a,Image *b)

{
  Image tmp;
  Image IStack_a8;
  
  pbrt::Image::Image(&IStack_a8,a);
  pbrt::Image::operator=(a,b);
  pbrt::Image::operator=(b,&IStack_a8);
  pbrt::Image::~Image(&IStack_a8);
  return;
}

Assistant:

PBRT_CPU_GPU inline void swap(T &a, T &b) {
    T tmp = std::move(a);
    a = std::move(b);
    b = std::move(tmp);
}